

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExecuteCommand
          (cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  bool bVar1;
  WorkingMode WVar2;
  int code;
  size_t sVar3;
  ostream *poVar4;
  cmState *this_00;
  string *psVar5;
  cmake *pcVar6;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__args;
  string *args;
  undefined1 local_2a0 [8];
  string error_1;
  undefined1 local_278 [8];
  string error;
  undefined1 local_250 [6];
  bool hadNestedError;
  bool invokeSucceeded;
  Command command;
  string local_228;
  undefined1 local_208 [8];
  ostringstream e;
  size_t depthLimit;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_50 [8];
  cmMakefileCall stack_manager;
  bool result;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *deferId_local;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  stack_manager.ProfilingDataRAII.super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>.
  _M_payload.super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ = 1;
  bVar1 = IsFunctionBlocked(this,lff,status);
  if (bVar1) {
    this_local._7_1_ =
         (bool)(stack_manager.ProfilingDataRAII.
                super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
                super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
                super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ & 1);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->ExecuteCommandCallback);
    if (bVar1) {
      std::function<void_()>::operator()(&this->ExecuteCommandCallback);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_78,deferId);
    cmMakefileCall::cmMakefileCall((cmMakefileCall *)local_50,this,lff,&local_78,status);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_78);
    sVar3 = GetRecursionDepthLimit(this);
    if (sVar3 < this->RecursionDepth) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      poVar4 = std::operator<<((ostream *)local_208,"Maximum recursion depth of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
      std::operator<<(poVar4," exceeded");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      cmSystemTools::SetFatalErrorOccurred();
      this_local._7_1_ = false;
      command._M_invoker._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    }
    else {
      this_00 = GetState(this);
      psVar5 = cmListFileFunction::LowerCaseName_abi_cxx11_(lff);
      cmState::GetCommandByExactName((Command *)local_250,this_00,psVar5);
      bVar1 = std::function::operator_cast_to_bool((function *)local_250);
      if (bVar1) {
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        if (!bVar1) {
          pcVar6 = GetCMakeInstance(this);
          bVar1 = cmake::GetTrace(pcVar6);
          if (bVar1) {
            PrintCommandTrace(this,lff,&this->Backtrace,No);
          }
          __args = cmListFileFunction::Arguments(lff);
          error.field_2._M_local_buf[0xf] =
               std::
               function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
               ::operator()((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                             *)local_250,__args,status);
          error.field_2._M_local_buf[0xe] = cmExecutionStatus::GetNestedError(status);
          if (((error.field_2._M_local_buf[0xf] & 1U) == 0) ||
             ((bool)error.field_2._M_local_buf[0xe])) {
            if (!(bool)error.field_2._M_local_buf[0xe]) {
              psVar5 = cmListFileFunction::OriginalName_abi_cxx11_(lff);
              error_1.field_2._M_local_buf[0xf] = ' ';
              args = cmExecutionStatus::GetError_abi_cxx11_(status);
              cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                        ((string *)local_278,psVar5,error_1.field_2._M_local_buf + 0xf,args);
              IssueMessage(this,FATAL_ERROR,(string *)local_278);
              std::__cxx11::string::~string((string *)local_278);
            }
            stack_manager.ProfilingDataRAII.
            super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
            super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
            super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ = 0;
            pcVar6 = GetCMakeInstance(this);
            WVar2 = cmake::GetWorkingMode(pcVar6);
            if (WVar2 != NORMAL_MODE) {
              cmSystemTools::SetFatalErrorOccurred();
            }
          }
          pcVar6 = GetCMakeInstance(this);
          bVar1 = cmake::HasScriptModeExitCode(pcVar6);
          if (bVar1) {
            pcVar6 = GetCMakeInstance(this);
            WVar2 = cmake::GetWorkingMode(pcVar6);
            if (WVar2 == SCRIPT_MODE) {
              pcVar6 = GetCMakeInstance(this);
              code = cmake::GetScriptModeExitCode(pcVar6);
              cmExecutionStatus::SetExitCode(status,code);
            }
          }
        }
      }
      else {
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        if (!bVar1) {
          psVar5 = cmListFileFunction::OriginalName_abi_cxx11_(lff);
          cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[3]>
                    ((string *)local_2a0,(char (*) [24])"Unknown CMake command \"",psVar5,
                     (char (*) [3])0x11185a2);
          IssueMessage(this,FATAL_ERROR,(string *)local_2a0);
          stack_manager.ProfilingDataRAII.
          super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
          super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
          super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ = 0;
          cmSystemTools::SetFatalErrorOccurred();
          std::__cxx11::string::~string((string *)local_2a0);
        }
      }
      std::
      function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
      ::~function((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                   *)local_250);
      this_local._7_1_ =
           (bool)(stack_manager.ProfilingDataRAII.
                  super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
                  super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
                  super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ & 1);
      command._M_invoker._4_4_ = 1;
    }
    cmMakefileCall::~cmMakefileCall((cmMakefileCall *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status,
                                cm::optional<std::string> deferId)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  if (this->ExecuteCommandCallback) {
    this->ExecuteCommandCallback();
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, std::move(deferId), status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  size_t depthLimit = this->GetRecursionDepthLimit();
  if (this->RecursionDepth > depthLimit) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depthLimit << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Lookup the command prototype.
  if (cmState::Command command =
        this->GetState()->GetCommandByExactName(lff.LowerCaseName())) {
    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff, this->Backtrace);
      }
      // Try invoking the command.
      bool invokeSucceeded = command(lff.Arguments(), status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            cmStrCat(lff.OriginalName(), ' ', status.GetError());
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccurred();
        }
      }
      if (this->GetCMakeInstance()->HasScriptModeExitCode() &&
          this->GetCMakeInstance()->GetWorkingMode() == cmake::SCRIPT_MODE) {
        // pass-through the exit code from inner cmake_language(EXIT) ,
        // possibly from include() or similar command...
        status.SetExitCode(this->GetCMakeInstance()->GetScriptModeExitCode());
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      std::string error =
        cmStrCat("Unknown CMake command \"", lff.OriginalName(), "\".");
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return result;
}